

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool SignPSBTInput(SigningProvider *provider,PartiallySignedTransaction *psbt,int index,
                  PrecomputedTransactionData *txdata,int sighash,SignatureData *out_sigdata,
                  bool finalize)

{
  byte bVar1;
  bool bVar2;
  reference this;
  PartiallySignedTransaction *tx_00;
  const_reference __src;
  size_type sVar3;
  long in_RCX;
  SignatureData *in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  bool sig_complete;
  bool require_witness_sig;
  CMutableTransaction *tx;
  PSBTInput *input;
  MutableTransactionSignatureCreator creator;
  COutPoint prevout;
  CTxOut utxo;
  SignatureData sigdata;
  SignatureData *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa34;
  undefined1 in_stack_fffffffffffffa35;
  undefined1 in_stack_fffffffffffffa36;
  undefined1 in_stack_fffffffffffffa37;
  CTxOut *in_stack_fffffffffffffa38;
  CTxOut *this_00;
  int hash_type;
  undefined2 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5b;
  undefined4 in_stack_fffffffffffffa5c;
  uint in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  uint in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffab8;
  uint in_stack_fffffffffffffabc;
  PartiallySignedTransaction *in_stack_fffffffffffffac0;
  vector<CKeyID,_std::allocator<CKeyID>_> *in_stack_fffffffffffffac8;
  undefined1 local_4ec [32];
  uint local_4cc;
  SignatureData *in_stack_fffffffffffffb40;
  CScript *in_stack_fffffffffffffb48;
  BaseSignatureCreator *in_stack_fffffffffffffb50;
  SigningProvider *in_stack_fffffffffffffb58;
  CTxOut local_4a0 [4];
  SignatureData *in_stack_fffffffffffffc18;
  PSBTInput *in_stack_fffffffffffffc20;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f4;
  undefined8 local_1ec;
  undefined8 local_1e4;
  undefined8 local_1dc;
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                   ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffa38,
                    CONCAT17(in_stack_fffffffffffffa37,
                             CONCAT16(in_stack_fffffffffffffa36,
                                      CONCAT15(in_stack_fffffffffffffa35,
                                               CONCAT14(in_stack_fffffffffffffa34,
                                                        in_stack_fffffffffffffa30)))));
  tx_00 = (PartiallySignedTransaction *)
          std::optional<CMutableTransaction>::operator*
                    ((optional<CMutableTransaction> *)in_stack_fffffffffffffa28);
  hash_type = (int)((ulong)local_110 >> 0x20);
  PartiallySignedTransaction::PartiallySignedTransaction((PartiallySignedTransaction *)this,tx_00);
  bVar1 = PSBTInputSignedAndVerified
                    (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,
                     (PrecomputedTransactionData *)in_RDI);
  PartiallySignedTransaction::~PartiallySignedTransaction
            ((PartiallySignedTransaction *)in_stack_fffffffffffffa28);
  if ((bVar1 & 1) != 0) {
    bVar1 = 1;
    goto LAB_00e1b4ca;
  }
  this_00 = local_4a0;
  SignatureData::SignatureData
            ((SignatureData *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  PSBTInput::FillSignatureData(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  in_stack_fffffffffffffa60 = in_stack_fffffffffffffa60 & 0xffffff;
  CTxOut::CTxOut(this_00);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_fffffffffffffa28);
  if (bVar2) {
    __src = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffa38,
                       CONCAT17(in_stack_fffffffffffffa37,
                                CONCAT16(in_stack_fffffffffffffa36,
                                         CONCAT15(in_stack_fffffffffffffa35,
                                                  CONCAT14(in_stack_fffffffffffffa34,
                                                           in_stack_fffffffffffffa30)))));
    memcpy(local_4ec,__src,0x24);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffa28);
    sVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa28);
    if (local_4cc < sVar3) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffa28);
      in_stack_fffffffffffffa38 =
           (CTxOut *)CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffa28);
      in_stack_fffffffffffffa37 =
           transaction_identifier<false>::operator!=
                     ((transaction_identifier<false> *)in_stack_fffffffffffffa38,
                      (transaction_identifier<false> *)
                      CONCAT17(in_stack_fffffffffffffa37,
                               CONCAT16(in_stack_fffffffffffffa36,
                                        CONCAT15(in_stack_fffffffffffffa35,
                                                 CONCAT14(in_stack_fffffffffffffa34,
                                                          in_stack_fffffffffffffa30)))));
      if (!(bool)in_stack_fffffffffffffa37) {
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffa28);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa38,
                   CONCAT17(in_stack_fffffffffffffa37,
                            CONCAT16(in_stack_fffffffffffffa36,
                                     CONCAT15(in_stack_fffffffffffffa35,
                                              CONCAT14(in_stack_fffffffffffffa34,
                                                       in_stack_fffffffffffffa30)))));
        CTxOut::operator=(in_stack_fffffffffffffa38,
                          (CTxOut *)
                          CONCAT17(in_stack_fffffffffffffa37,
                                   CONCAT16(in_stack_fffffffffffffa36,
                                            CONCAT15(in_stack_fffffffffffffa35,
                                                     CONCAT14(in_stack_fffffffffffffa34,
                                                              in_stack_fffffffffffffa30)))));
        goto LAB_00e1b2b8;
      }
      bVar1 = 0;
    }
    else {
      bVar1 = 0;
    }
  }
  else {
    in_stack_fffffffffffffa36 = CTxOut::IsNull((CTxOut *)in_stack_fffffffffffffa28);
    if ((bool)in_stack_fffffffffffffa36) {
      bVar1 = 0;
    }
    else {
      CTxOut::operator=(in_stack_fffffffffffffa38,
                        (CTxOut *)
                        CONCAT17(in_stack_fffffffffffffa37,
                                 CONCAT16(in_stack_fffffffffffffa36,
                                          CONCAT15(in_stack_fffffffffffffa35,
                                                   CONCAT14(in_stack_fffffffffffffa34,
                                                            in_stack_fffffffffffffa30)))));
      in_stack_fffffffffffffa60 = CONCAT13(1,(int3)in_stack_fffffffffffffa60);
LAB_00e1b2b8:
      local_4a0[0].nValue._1_1_ = 0;
      if (in_RCX == 0) {
        in_stack_fffffffffffffa35 =
             ProduceSignature(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                              in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        bVar1 = in_stack_fffffffffffffa35;
      }
      else {
        MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                  ((MutableTransactionSignatureCreator *)this,(CMutableTransaction *)tx_00,
                   in_stack_fffffffffffffa6c,
                   (CAmount *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                   (PrecomputedTransactionData *)
                   CONCAT44(in_stack_fffffffffffffa5c,
                            CONCAT13(in_stack_fffffffffffffa5b,
                                     CONCAT12(bVar1,in_stack_fffffffffffffa58))),hash_type);
        in_stack_fffffffffffffa34 =
             ProduceSignature(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                              in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        bVar1 = in_stack_fffffffffffffa34;
      }
      if (((in_stack_fffffffffffffa60 & 0x1000000) == 0) || ((local_4a0[0].nValue._1_1_ & 1) != 0))
      {
        if (((in_stack_00000008 & 1) == 0) && (((byte)local_4a0[0].nValue & 1) != 0)) {
          local_4a0[0].nValue._0_1_ = 0;
        }
        PSBTInput::FromSignatureData
                  ((PSBTInput *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),in_RDI
                  );
        if ((local_4a0[0].nValue._1_1_ & 1) != 0) {
          CTxOut::operator=(in_stack_fffffffffffffa38,
                            (CTxOut *)
                            CONCAT17(in_stack_fffffffffffffa37,
                                     CONCAT16(in_stack_fffffffffffffa36,
                                              CONCAT15(in_stack_fffffffffffffa35,
                                                       CONCAT14(in_stack_fffffffffffffa34,
                                                                in_stack_fffffffffffffa30)))));
        }
        if (in_R9 != 0) {
          std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                    (in_stack_fffffffffffffac8,
                     (vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffac0);
          std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                    (in_stack_fffffffffffffac8,
                     (vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffac0);
          *(undefined8 *)(in_R9 + 0x298) = local_208;
          *(undefined8 *)(in_R9 + 0x2a0) = local_200;
          *(undefined4 *)(in_R9 + 0x2a8) = local_1f8;
          *(undefined8 *)(in_R9 + 0x2ac) = local_1f4;
          *(undefined8 *)(in_R9 + 0x2b4) = local_1ec;
          *(undefined8 *)(in_R9 + 700) = local_1e4;
          *(undefined8 *)(in_R9 + 0x2c4) = local_1dc;
        }
        bVar1 = bVar1 & 1;
      }
      else {
        bVar1 = 0;
      }
    }
  }
  CTxOut::~CTxOut((CTxOut *)in_stack_fffffffffffffa28);
  SignatureData::~SignatureData(in_stack_fffffffffffffa28);
LAB_00e1b4ca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool SignPSBTInput(const SigningProvider& provider, PartiallySignedTransaction& psbt, int index, const PrecomputedTransactionData* txdata, int sighash,  SignatureData* out_sigdata, bool finalize)
{
    PSBTInput& input = psbt.inputs.at(index);
    const CMutableTransaction& tx = *psbt.tx;

    if (PSBTInputSignedAndVerified(psbt, index, txdata)) {
        return true;
    }

    // Fill SignatureData with input info
    SignatureData sigdata;
    input.FillSignatureData(sigdata);

    // Get UTXO
    bool require_witness_sig = false;
    CTxOut utxo;

    if (input.non_witness_utxo) {
        // If we're taking our information from a non-witness UTXO, verify that it matches the prevout.
        COutPoint prevout = tx.vin[index].prevout;
        if (prevout.n >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout.n];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
        // When we're taking our information from a witness UTXO, we can't verify it is actually data from
        // the output being spent. This is safe in case a witness signature is produced (which includes this
        // information directly in the hash), but not for non-witness signatures. Remember that we require
        // a witness signature in this situation.
        require_witness_sig = true;
    } else {
        return false;
    }

    sigdata.witness = false;
    bool sig_complete;
    if (txdata == nullptr) {
        sig_complete = ProduceSignature(provider, DUMMY_SIGNATURE_CREATOR, utxo.scriptPubKey, sigdata);
    } else {
        MutableTransactionSignatureCreator creator(tx, index, utxo.nValue, txdata, sighash);
        sig_complete = ProduceSignature(provider, creator, utxo.scriptPubKey, sigdata);
    }
    // Verify that a witness signature was produced in case one was required.
    if (require_witness_sig && !sigdata.witness) return false;

    // If we are not finalizing, set sigdata.complete to false to not set the scriptWitness
    if (!finalize && sigdata.complete) sigdata.complete = false;

    input.FromSignatureData(sigdata);

    // If we have a witness signature, put a witness UTXO.
    if (sigdata.witness) {
        input.witness_utxo = utxo;
        // We can remove the non_witness_utxo if and only if there are no non-segwit or segwit v0
        // inputs in this transaction. Since this requires inspecting the entire transaction, this
        // is something for the caller to deal with (i.e. FillPSBT).
    }

    // Fill in the missing info
    if (out_sigdata) {
        out_sigdata->missing_pubkeys = sigdata.missing_pubkeys;
        out_sigdata->missing_sigs = sigdata.missing_sigs;
        out_sigdata->missing_redeem_script = sigdata.missing_redeem_script;
        out_sigdata->missing_witness_script = sigdata.missing_witness_script;
    }

    return sig_complete;
}